

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

void __thiscall Address::Address(Address *this)

{
  (this->country)._M_dataplus._M_p = (pointer)&(this->country).field_2;
  (this->country)._M_string_length = 0;
  (this->country).field_2._M_local_buf[0] = '\0';
  (this->city)._M_dataplus._M_p = (pointer)&(this->city).field_2;
  (this->city)._M_string_length = 0;
  (this->city).field_2._M_local_buf[0] = '\0';
  (this->street)._M_dataplus._M_p = (pointer)&(this->street).field_2;
  (this->street)._M_string_length = 0;
  (this->street).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->city);
  std::__cxx11::string::assign((char *)&this->street);
  return;
}

Assistant:

Address::Address() {
     country="";
     city="";
     street="";

}